

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui.cpp
# Opt level: O0

void LockWheelingWindow(ImGuiWindow *window,float wheel_amount)

{
  ImGuiWindow *in_RDI;
  float in_XMM0_Da;
  float fVar1;
  float fVar2;
  ImGuiContext *g;
  char *local_30;
  ImVec2 local_20;
  ImGuiContext *local_18;
  ImGuiWindow *local_8;
  
  local_18 = GImGui;
  local_8 = in_RDI;
  if (in_RDI == (ImGuiWindow *)0x0) {
    GImGui->WheelingWindowReleaseTimer = 0.0;
  }
  else {
    fVar2 = GImGui->WheelingWindowReleaseTimer;
    fVar1 = ImAbs(in_XMM0_Da);
    fVar2 = ImMin<float>(fVar1 * 0.7 + fVar2,0.7);
    local_18->WheelingWindowReleaseTimer = fVar2;
  }
  if (local_18->WheelingWindow != local_8) {
    if ((local_18->DebugLogFlags & 0x40U) != 0) {
      if (local_8 == (ImGuiWindow *)0x0) {
        local_30 = "NULL";
      }
      else {
        local_30 = local_8->Name;
      }
      ImGui::DebugLog("[io] LockWheelingWindow() \"%s\"\n",local_30);
    }
    local_18->WheelingWindow = local_8;
    local_18->WheelingWindowRefMousePos = (local_18->IO).MousePos;
    if (local_8 == (ImGuiWindow *)0x0) {
      local_18->WheelingWindowStartFrame = -1;
      ImVec2::ImVec2(&local_20,0.0,0.0);
      local_18->WheelingAxisAvg = local_20;
    }
  }
  return;
}

Assistant:

static void LockWheelingWindow(ImGuiWindow* window, float wheel_amount)
{
    ImGuiContext& g = *GImGui;
    if (window)
        g.WheelingWindowReleaseTimer = ImMin(g.WheelingWindowReleaseTimer + ImAbs(wheel_amount) * WINDOWS_MOUSE_WHEEL_SCROLL_LOCK_TIMER, WINDOWS_MOUSE_WHEEL_SCROLL_LOCK_TIMER);
    else
        g.WheelingWindowReleaseTimer = 0.0f;
    if (g.WheelingWindow == window)
        return;
    IMGUI_DEBUG_LOG_IO("[io] LockWheelingWindow() \"%s\"\n", window ? window->Name : "NULL");
    g.WheelingWindow = window;
    g.WheelingWindowRefMousePos = g.IO.MousePos;
    if (window == NULL)
    {
        g.WheelingWindowStartFrame = -1;
        g.WheelingAxisAvg = ImVec2(0.0f, 0.0f);
    }
}